

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::substitute(SimpSolver *this,Var v,Lit x)

{
  uint uVar1;
  Lit p_00;
  bool bVar2;
  Size SVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  vec<unsigned_int,_int> *this_00;
  vec<Minisat::Lit,_int> *this_01;
  uint *puVar7;
  Lit *pLVar8;
  uchar *tbs;
  size_t *siglen;
  uchar *sig;
  size_t in_R8;
  Lit local_4c;
  uint local_48;
  uint local_44;
  Lit p;
  int j;
  Clause *c;
  int i;
  vec<Minisat::Lit,_int> *subst_clause;
  vec<unsigned_int,_int> *cls;
  SimpSolver *pSStack_18;
  Var v_local;
  SimpSolver *this_local;
  Lit x_local;
  
  cls._4_4_ = v;
  pSStack_18 = this;
  this_local._0_4_ = x.x;
  pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,v);
  if (*pcVar6 != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x224,"bool Minisat::SimpSolver::substitute(Var, Lit)");
  }
  bVar2 = isEliminated(this,cls._4_4_);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    cls._3_1_ = Solver::value(&this->super_Solver,cls._4_4_);
    cls._2_1_ = l_Undef.value;
    bVar2 = lbool::operator==((lbool *)((long)&cls + 3),l_Undef);
    if (!bVar2) {
      __assert_fail("value(v) == l_Undef",
                    "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                    ,0x226,"bool Minisat::SimpSolver::substitute(Var, Lit)");
    }
    if (((this->super_Solver).ok & 1U) == 0) {
      this_local._7_1_ = false;
    }
    else {
      pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>
                          ,cls._4_4_);
      *pcVar6 = '\x01';
      Solver::setDecisionVar(&this->super_Solver,cls._4_4_,false);
      this_00 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                ::lookup(&this->occurs,(int *)((long)&cls + 4));
      this_01 = &(this->super_Solver).add_tmp;
      for (c._4_4_ = 0; SVar3 = vec<unsigned_int,_int>::size(this_00), c._4_4_ < SVar3;
          c._4_4_ = c._4_4_ + 1) {
        puVar7 = vec<unsigned_int,_int>::operator[](this_00,c._4_4_);
        _p = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar7);
        vec<Minisat::Lit,_int>::clear(this_01,false);
        local_44 = 0;
        while( true ) {
          uVar1 = local_44;
          uVar4 = Clause::size(_p);
          tbs = (uchar *)(ulong)uVar4;
          if ((int)uVar4 <= (int)uVar1) break;
          sig = (uchar *)(ulong)local_44;
          pLVar8 = Clause::operator[](_p,local_44);
          local_48 = pLVar8->x;
          iVar5 = var((Lit)local_48);
          p_00.x = this_local._0_4_;
          if (iVar5 == cls._4_4_) {
            iVar5 = sign((EVP_PKEY_CTX *)(ulong)local_48,sig,siglen,tbs,in_R8);
            local_4c = operator^(p_00,(bool)((byte)iVar5 & 1));
          }
          else {
            local_4c.x = local_48;
          }
          vec<Minisat::Lit,_int>::push(this_01,&local_4c);
          local_44 = local_44 + 1;
        }
        puVar7 = vec<unsigned_int,_int>::operator[](this_00,c._4_4_);
        removeClause(this,*puVar7);
        bVar2 = addClause_(this,this_01);
        if (!bVar2) {
          (this->super_Solver).ok = false;
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    return this_local._7_1_;
  }
  __assert_fail("!isEliminated(v)",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                ,0x225,"bool Minisat::SimpSolver::substitute(Var, Lit)");
}

Assistant:

bool SimpSolver::substitute(Var v, Lit x)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    if (!ok) return false;

    eliminated[v] = true;
    setDecisionVar(v, false);
    const vec<CRef>& cls = occurs.lookup(v);
    
    vec<Lit>& subst_clause = add_tmp;
    for (int i = 0; i < cls.size(); i++){
        Clause& c = ca[cls[i]];

        subst_clause.clear();
        for (int j = 0; j < c.size(); j++){
            Lit p = c[j];
            subst_clause.push(var(p) == v ? x ^ sign(p) : p);
        }

        removeClause(cls[i]);

        if (!addClause_(subst_clause))
            return ok = false;
    }

    return true;
}